

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

s3wid_t dict_add_word(dict_t *d,char *word,s3cipid_t *p,int32 np)

{
  dictword_t *pdVar1;
  uint uVar2;
  int32 iVar3;
  char *key;
  void *pvVar4;
  dictword_t *pdVar5;
  s3cipid_t *__dest;
  int iVar6;
  void *val;
  int local_38 [2];
  
  iVar6 = d->n_word;
  if (iVar6 < d->max_words) {
    pdVar1 = d->word;
    pdVar5 = pdVar1 + iVar6;
    key = __ckd_salloc__(word,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                         ,0xb5);
    pdVar1[iVar6].word = key;
    pvVar4 = hash_table_enter(d->ht,key,(void *)(long)d->n_word);
    iVar6 = d->n_word;
    if (pvVar4 == (void *)(long)iVar6) {
      if (np < 1 || p == (s3cipid_t *)0x0) {
        pdVar5->ciphone = (s3cipid_t *)0x0;
        np = 0;
      }
      else {
        __dest = (s3cipid_t *)
                 __ckd_malloc__((ulong)(uint)(np * 2),
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                                ,0xbf);
        pdVar5->ciphone = __dest;
        memcpy(__dest,p,(ulong)(uint)(np * 2));
        iVar6 = d->n_word;
      }
      pdVar5->pronlen = np;
      pdVar5->alt = -1;
      pdVar5->basewid = iVar6;
      uVar2 = dict_word2basestr(word);
      if ((int)uVar2 < 1) {
        iVar6 = d->n_word;
      }
      else {
        iVar3 = hash_table_lookup(d->ht,word,(void **)local_38);
        word[uVar2] = '(';
        if (iVar3 < 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                  ,0xd2,"Missing base word for \'%s\'\n",word);
          exit(1);
        }
        pdVar5->basewid = local_38[0];
        pdVar1 = d->word;
        pdVar5->alt = pdVar1[local_38[0]].alt;
        iVar6 = d->n_word;
        pdVar1[local_38[0]].alt = iVar6;
      }
      d->n_word = iVar6 + 1;
      return iVar6;
    }
    ckd_free(pdVar5->word);
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
            ,0xaa,"Dictionary max size (%d) exceeded; reallocate another entries %d \n",
            (ulong)(uint)d->max_words,0x1000);
    pdVar5 = (dictword_t *)
             __ckd_realloc__(d->word,(long)d->max_words * 0x20 + 0x20000,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                             ,0xae);
    d->word = pdVar5;
    d->max_words = d->max_words + 0x1000;
  }
  return -1;
}

Assistant:

s3wid_t
dict_add_word(dict_t * d, char *word, s3cipid_t * p, int32 np)
{
    int32 len;
    dictword_t *wordp;
    s3wid_t newwid;

    if (d->n_word >= d->max_words) {
        E_INFO
            ("Dictionary max size (%d) exceeded; reallocate another entries %d \n",
             d->max_words, DICT_INC_SZ);
        d->word =
            (dictword_t *) ckd_realloc(d->word,
                                       (d->max_words +
                                        DICT_INC_SZ) * sizeof(dictword_t));
        d->max_words = d->max_words + DICT_INC_SZ;

        return (BAD_S3WID);
    }

    wordp = d->word + d->n_word;
    wordp->word = (char *) ckd_salloc(word);    /* Freed in dict_free */

    /* Associate word string with d->n_word in hash table */
    if (hash_table_enter(d->ht, wordp->word, (void *)(long)d->n_word) != (void *)(long)d->n_word) {
        ckd_free(wordp->word);
        return (BAD_S3WID);
    }

    /* Fill in word entry, and set defaults */
    if (p && (np > 0)) {
        wordp->ciphone = (s3cipid_t *) ckd_malloc(np * sizeof(s3cipid_t));      /* Freed in dict_free */
        memcpy(wordp->ciphone, p, np * sizeof(s3cipid_t));
        wordp->pronlen = np;
    }
    else {
        wordp->ciphone = NULL;
        wordp->pronlen = 0;
    }
    wordp->alt = BAD_S3WID;
    wordp->basewid = d->n_word;

    /* Determine base/alt wids */
    if ((len = dict_word2basestr(word)) > 0) {
	void *val;
	s3wid_t w;

        /* Truncated to a baseword string; find its ID */
        if (hash_table_lookup(d->ht, word, &val) < 0) {
            word[len] = '(';    /* Get back the original word */
            E_FATAL("Missing base word for '%s'\n", word);
        }
        else
            word[len] = '(';    /* Get back the original word */

        /* Link into alt list */
	w = (s3wid_t)(long)val;
        wordp->basewid = w;
        wordp->alt = d->word[w].alt;
        d->word[w].alt = d->n_word;
    }

    newwid = d->n_word++;

    return (newwid);
}